

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBinaryReader::ConstNode<(Wasm::WasmTypes::WasmType)5>(WasmBinaryReader *this)

{
  uint uVar1;
  uint uStack_18;
  uint i;
  uint32 len;
  WasmBinaryReader *this_local;
  
  Simd::EnsureSimdIsEnabled();
  for (uStack_18 = 0; uStack_18 < 4; uStack_18 = uStack_18 + 1) {
    uVar1 = ReadConst<unsigned_int>(this);
    *(uint *)((long)&(this->super_WasmReaderBase).m_currentNode.field_1 + (ulong)uStack_18 * 4) =
         uVar1;
  }
  (this->m_funcState).count = (this->m_funcState).count + 4;
  return;
}

Assistant:

void WasmBinaryReader::ConstNode()
{
    uint32 len = 0;
    switch (localType)
    {
    case WasmTypes::I32:
        m_currentNode.cnst.i32 = SLEB128(len);
        m_funcState.count += len;
        break;
    case WasmTypes::I64:
        m_currentNode.cnst.i64 = SLEB128<int64>(len);
        m_funcState.count += len;
        break;
    case WasmTypes::F32:
    {
        m_currentNode.cnst.i32 = ReadConst<int32>();
        CompileAssert(sizeof(int32) == sizeof(float));
        m_funcState.count += sizeof(float);
        break;
    }
    case WasmTypes::F64:
        m_currentNode.cnst.i64 = ReadConst<int64>();
        CompileAssert(sizeof(int64) == sizeof(double));
        m_funcState.count += sizeof(double);
        break;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Simd::EnsureSimdIsEnabled();
        for (uint i = 0; i < Simd::VEC_WIDTH; i++) 
        {
            m_currentNode.cnst.v128[i] = ReadConst<uint>();
        }
        m_funcState.count += Simd::VEC_WIDTH;
        break;
#endif
    default:
        WasmTypes::CompileAssertCases<Wasm::WasmTypes::I32, Wasm::WasmTypes::I64, Wasm::WasmTypes::F32, Wasm::WasmTypes::F64, WASM_V128_CHECK_TYPE>();
    }
}